

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrShaderProgram.cpp
# Opt level: O0

ShaderProgramDeclaration * __thiscall
sglr::pdec::ShaderProgramDeclaration::operator<<
          (ShaderProgramDeclaration *this,VertexToFragmentVarying *v)

{
  VertexToFragmentVarying *v_local;
  ShaderProgramDeclaration *this_local;
  
  std::
  vector<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
  ::push_back(&this->m_vertexToFragmentVaryings,v);
  return this;
}

Assistant:

ShaderProgramDeclaration& pdec::ShaderProgramDeclaration::operator<< (const VertexToFragmentVarying& v)
{
	m_vertexToFragmentVaryings.push_back(v);
	return *this;
}